

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O2

int uv_sem_init(uv_sem_t *sem,uint value)

{
  int iVar1;
  int iVar2;
  uv_mutex_t *mutex;
  int *piVar3;
  
  uv_once(&glibc_version_check_once,glibc_version_check);
  if (platform_needs_custom_semaphore == 0) {
    iVar1 = 0;
    iVar2 = sem_init((sem_t *)sem,0,value);
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      iVar1 = -*piVar3;
    }
  }
  else {
    mutex = (uv_mutex_t *)uv__malloc(0x60);
    if (mutex == (uv_mutex_t *)0x0) {
      iVar1 = -0xc;
    }
    else {
      iVar1 = uv_mutex_init(mutex);
      if (iVar1 == 0) {
        iVar1 = uv_cond_init((uv_cond_t *)(mutex + 1));
        if (iVar1 == 0) {
          *(uint *)((long)mutex + 0x58) = value;
          *(uv_mutex_t **)sem = mutex;
          return 0;
        }
        uv_mutex_destroy(mutex);
      }
      uv__free(mutex);
    }
  }
  return iVar1;
}

Assistant:

int uv_sem_init(uv_sem_t* sem, unsigned int value) {
#if defined(__GLIBC__) && !defined(__UCLIBC__)
  uv_once(&glibc_version_check_once, glibc_version_check);
#endif

  if (platform_needs_custom_semaphore)
    return uv__custom_sem_init(sem, value);
  else
    return uv__sem_init(sem, value);
}